

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_key(json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            *this,string_view_type *name,ser_context *param_3,error_code *param_4)

{
  const_pointer pvVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  string local_40 [48];
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  
  local_10 = in_RSI;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(local_10);
  std::__cxx11::string::string(local_40,pvVar1,sVar2,(allocator *)(in_RDI + 8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_40);
  std::__cxx11::string::~string(local_40);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name, const ser_context&, std::error_code&) override
    {
        name_ = key_type(name.data(),name.length(),allocator_);
        JSONCONS_VISITOR_RETURN;
    }